

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int getPid(QString *package)

{
  QAnyStringView s;
  initializer_list<QString> args;
  QLatin1StringView latin1;
  bool bVar1;
  qsizetype qVar2;
  const_reference pQVar3;
  QStringList *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar4;
  QAnyStringView QVar5;
  int pid;
  bool ok;
  QList<QByteArray> columns;
  QList<QByteArray> lines;
  QStringList psArgs;
  QByteArray output;
  ArgBase *argBases [2];
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  size_t in_stack_fffffffffffffe40;
  QList<QByteArray> *this;
  char *in_stack_fffffffffffffe48;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 this_00;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_stack_fffffffffffffe50;
  QList<QByteArray> *pQVar6;
  char *in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  undefined1 verbose;
  QByteArray *output_00;
  int local_16c;
  byte local_139;
  undefined1 local_138 [24];
  QList<QByteArray> local_120;
  QList<QByteArray> local_108;
  QLatin1StringView local_f0;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  Data local_a0;
  qsizetype local_88;
  char *local_80;
  size_t local_78;
  ulong local_70;
  size_t local_68;
  ulong local_60;
  size_t local_58;
  ulong local_50;
  QList<QByteArray> local_48;
  undefined1 auStack_30 [24];
  QList<QByteArray> local_18;
  
  local_18.d.size = *(long *)(in_FS_OFFSET + 0x28);
  local_c8 = 0xaaaaaaaaaaaaaaaa;
  local_c0 = 0xaaaaaaaaaaaaaaaa;
  local_b8 = 0xaaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)0x107187);
  local_e0 = 0xaaaaaaaaaaaaaaaa;
  local_d8 = 0xaaaaaaaaaaaaaaaa;
  local_d0 = 0xaaaaaaaaaaaaaaaa;
  QVar4 = Qt::Literals::StringLiterals::operator____L1
                    (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  latin1.m_data._0_7_ = in_stack_fffffffffffffe78;
  latin1.m_size = (qsizetype)QVar4.m_data;
  latin1.m_data._7_1_ = in_stack_fffffffffffffe7f;
  QString::QString((QString *)in_stack_fffffffffffffe50.m_data,latin1);
  this_00.m_data = auStack_30;
  local_f0 = Qt::Literals::StringLiterals::operator____L1
                       (this_00.m_data_utf8,in_stack_fffffffffffffe40);
  local_88 = local_f0.m_size;
  local_80 = local_f0.m_data;
  QVar4.m_data = in_stack_fffffffffffffe58;
  QVar4.m_size = (qsizetype)in_stack_fffffffffffffe50.m_data;
  QAnyStringView::QAnyStringView((QAnyStringView *)this_00.m_data,QVar4);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)in_stack_fffffffffffffe50.m_data,(QString *)this_00.m_data);
  s.m_size = (size_t)in_stack_fffffffffffffe58;
  s.field_0.m_data = in_stack_fffffffffffffe50.m_data;
  QtPrivate::qStringLikeToArg(s);
  local_58 = local_78;
  local_50 = local_70;
  local_18.d.d = &local_a0;
  local_18.d.ptr = (QByteArray *)0x0;
  local_68 = local_78;
  local_60 = local_70;
  QVar5.m_size = local_78;
  QVar5.field_0.m_data = this_00.m_data;
  QtPrivate::argToQString(QVar5,local_70,(ArgBase **)0x1);
  verbose = (undefined1)((ulong)&local_48 >> 0x38);
  output_00 = (QByteArray *)0x2;
  args._M_len = (size_type)in_stack_fffffffffffffe58;
  args._M_array = (iterator)in_stack_fffffffffffffe50.m_data;
  QList<QString>::QList((QList<QString> *)this_00.m_data,args);
  pQVar6 = &local_48;
  this = &local_18;
  do {
    this = this + -1;
    QString::~QString((QString *)0x1073aa);
  } while (this != pQVar6);
  bVar1 = execAdbCommand(in_RDI,output_00,(bool)verbose);
  if (bVar1) {
    local_108.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_108.d.ptr = (QByteArray *)0xaaaaaaaaaaaaaaaa;
    local_108.d.size = -0x5555555555555556;
    QByteArray::split((char)&local_108);
    qVar2 = QList<QByteArray>::size(&local_108);
    if (qVar2 < 1) {
      local_16c = 0;
    }
    else {
      local_120.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_120.d.ptr = (QByteArray *)0xaaaaaaaaaaaaaaaa;
      local_120.d.size = -0x5555555555555556;
      QList<QByteArray>::first(this);
      QByteArray::simplified
                ((QByteArray *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      QByteArray::replace((char)local_138,'\t');
      QByteArray::split((char)&local_120);
      QByteArray::~QByteArray((QByteArray *)0x1074e0);
      qVar2 = QList<QByteArray>::size(&local_120);
      if (qVar2 < 3) {
        local_16c = 0;
      }
      else {
        local_139 = 0;
        pQVar3 = QList<QByteArray>::at
                           (this,CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
        local_16c = QByteArray::toInt((bool *)pQVar3,(int)&local_139);
        if ((local_139 & 1) == 0) {
          local_16c = -1;
        }
      }
      QList<QByteArray>::~QList((QList<QByteArray> *)0x107571);
    }
    QList<QByteArray>::~QList((QList<QByteArray> *)0x10757e);
  }
  else {
    local_16c = 0;
  }
  QList<QString>::~QList((QList<QString> *)0x10758b);
  QByteArray::~QByteArray((QByteArray *)0x107598);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18.d.size) {
    __stack_chk_fail();
  }
  return local_16c;
}

Assistant:

static int getPid(const QString &package)
{
    QByteArray output;
    const QStringList psArgs = { "shell"_L1, "ps | grep ' %1'"_L1.arg(package) };
    if (!execAdbCommand(psArgs, &output, false))
        return false;

    const QList<QByteArray> lines = output.split(u'\n');
    if (lines.size() < 1)
        return false;

    QList<QByteArray> columns = lines.first().simplified().replace(u'\t', u' ').split(u' ');
    if (columns.size() < 3)
        return false;

    bool ok = false;
    int pid = columns.at(1).toInt(&ok);
    if (ok)
        return pid;

    return -1;
}